

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_is_null.cpp
# Opt level: O1

unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> __thiscall
duckdb::Transformer::TransformNullTest(Transformer *this,PGNullTest *root)

{
  int iVar1;
  _Head_base<0UL,_duckdb::OperatorExpression_*,_false> _Var2;
  Transformer *this_00;
  type expr;
  NotImplementedException *this_01;
  long in_RDX;
  pointer *__ptr;
  templated_unique_single_t result;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> arg;
  _Head_base<0UL,_duckdb::OperatorExpression_*,_false> local_58;
  undefined1 local_50 [16];
  string local_40;
  
  TransformExpression((Transformer *)local_50,(optional_ptr<duckdb_libpgquery::PGNode,_true>)root);
  if (*(char *)(in_RDX + 0x14) != '\x01') {
    iVar1 = *(int *)(in_RDX + 0x10);
    this_00 = (Transformer *)operator_new(0x50);
    local_40._M_dataplus._M_p = (pointer)local_50._0_8_;
    local_50._0_8_ = (Transformer *)0x0;
    local_50._8_8_ = (ParserOptions *)0x0;
    OperatorExpression::OperatorExpression
              ((OperatorExpression *)this_00,OPERATOR_IS_NOT_NULL - (iVar1 == 0),
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)(local_50 + 0x10),
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)(local_50 + 8));
    local_58._M_head_impl = (OperatorExpression *)this_00;
    if ((ParserOptions *)local_50._8_8_ != (ParserOptions *)0x0) {
      (**(code **)(*(long *)local_50._8_8_ + 8))();
    }
    local_50._8_8_ = (ParserOptions *)0x0;
    if ((Transformer *)local_40._M_dataplus._M_p != (Transformer *)0x0) {
      (**(code **)(*(long *)local_40._M_dataplus._M_p + 8))();
    }
    expr = unique_ptr<duckdb::OperatorExpression,_std::default_delete<duckdb::OperatorExpression>,_true>
           ::operator*((unique_ptr<duckdb::OperatorExpression,_std::default_delete<duckdb::OperatorExpression>,_true>
                        *)&local_58);
    SetQueryLocation(&expr->super_ParsedExpression,*(int *)(in_RDX + 0x18));
    _Var2._M_head_impl = local_58._M_head_impl;
    local_58._M_head_impl = (OperatorExpression *)0x0;
    (this->parent).ptr = (Transformer *)_Var2._M_head_impl;
    if ((Transformer *)local_50._0_8_ != (Transformer *)0x0) {
      (*(code *)((optional_ptr<duckdb::Transformer,_true> *)local_50._0_8_)->ptr->options)();
    }
    return (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
           (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
           this;
  }
  this_01 = (NotImplementedException *)__cxa_allocate_exception(0x10);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)(local_50 + 0x10),"IS NULL argisrow","");
  NotImplementedException::NotImplementedException(this_01,(string *)(local_50 + 0x10));
  __cxa_throw(this_01,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

unique_ptr<ParsedExpression> Transformer::TransformNullTest(duckdb_libpgquery::PGNullTest &root) {
	auto arg = TransformExpression(PGPointerCast<duckdb_libpgquery::PGNode>(root.arg));
	if (root.argisrow) {
		throw NotImplementedException("IS NULL argisrow");
	}
	ExpressionType expr_type = (root.nulltesttype == duckdb_libpgquery::PG_IS_NULL)
	                               ? ExpressionType::OPERATOR_IS_NULL
	                               : ExpressionType::OPERATOR_IS_NOT_NULL;

	auto result = make_uniq<OperatorExpression>(expr_type, std::move(arg));
	SetQueryLocation(*result, root.location);
	return std::move(result);
}